

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::GenerateImportFile(cmGlobalGenerator *this,string *file)

{
  bool bVar1;
  iterator __position;
  pointer ppcVar2;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
               ::find(&(this->BuildExportSets)._M_t,file);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = false;
  }
  else {
    bVar1 = cmExportFileGenerator::GenerateImportFile
                      (*(cmExportFileGenerator **)(__position._M_node + 2));
    if (this->ConfigureDoneCMP0026AndCMP0024 == false) {
      for (ppcVar2 = (this->Makefiles).
                     super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppcVar2 !=
          (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
        cmMakefile::RemoveExportBuildFileGeneratorCMP0024
                  (*ppcVar2,*(cmExportBuildFileGenerator **)(__position._M_node + 2));
      }
    }
    if (*(long **)(__position._M_node + 2) != (long *)0x0) {
      (**(code **)(**(long **)(__position._M_node + 2) + 8))();
    }
    *(undefined8 *)(__position._M_node + 2) = 0;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
                        *)&this->BuildExportSets,__position);
  }
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::GenerateImportFile(const std::string &file)
{
  std::map<std::string, cmExportBuildFileGenerator*>::iterator it
                                          = this->BuildExportSets.find(file);
  if (it != this->BuildExportSets.end())
    {
    bool result = it->second->GenerateImportFile();

    if (!this->ConfigureDoneCMP0026AndCMP0024)
      {
      for (std::vector<cmMakefile*>::const_iterator mit =
           this->Makefiles.begin(); mit != this->Makefiles.end(); ++mit)
        {
        (*mit)->RemoveExportBuildFileGeneratorCMP0024(it->second);
        }
      }

    delete it->second;
    it->second = 0;
    this->BuildExportSets.erase(it);
    return result;
    }
  return false;
}